

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

SceneObject * __thiscall
CMU462::Application::init_sphere(Application *this,SphereInfo *sphere,Matrix4x4 *transform)

{
  Vector3D *this_00;
  Sphere *this_01;
  Vector4D local_e0;
  Vector4D local_c0;
  Vector3D local_a0;
  double local_88;
  double scale;
  Vector4D local_60;
  Vector3D local_40;
  Vector3D *local_28;
  Vector3D *position;
  Matrix4x4 *transform_local;
  SphereInfo *sphere_local;
  Application *this_local;
  
  position = (Vector3D *)transform;
  transform_local = (Matrix4x4 *)sphere;
  sphere_local = (SphereInfo *)this;
  Vector4D::Vector4D((Vector4D *)&scale,0.0,0.0,0.0,1.0);
  Matrix4x4::operator*(&local_60,transform,(Vector4D *)&scale);
  Vector4D::projectTo3D(&local_40,&local_60);
  this_00 = position;
  local_28 = &local_40;
  Vector4D::Vector4D(&local_e0,1.0,0.0,0.0,0.0);
  Matrix4x4::operator*(&local_c0,(Matrix4x4 *)this_00,&local_e0);
  Vector4D::to3D(&local_a0,&local_c0);
  local_88 = Vector3D::norm(&local_a0);
  this_01 = (Sphere *)operator_new(0x120);
  DynamicScene::Sphere::Sphere(this_01,(SphereInfo *)transform_local,local_28,local_88);
  return &this_01->super_SceneObject;
}

Assistant:

DynamicScene::SceneObject *Application::init_sphere(
    SphereInfo& sphere, const Matrix4x4& transform) {
  const Vector3D& position = (transform * Vector4D(0, 0, 0, 1)).projectTo3D();
  double scale = (transform * Vector4D(1, 0, 0, 0)).to3D().norm();
  return new DynamicScene::Sphere(sphere, position, scale);
}